

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

shared_ptr<spdlog::async_logger>
spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>::
create<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
          (string *logger_name,color_mode *args)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::details::thread_pool> *in_RSI;
  element_type *in_RDI;
  shared_ptr<spdlog::async_logger> sVar2;
  shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>_> sink;
  shared_ptr<spdlog::details::thread_pool> tp;
  lock_guard<std::recursive_mutex> tp_lock;
  recursive_mutex *mutex;
  registry *registry_inst;
  shared_ptr<spdlog::async_logger> *new_logger;
  mutex_type *in_stack_ffffffffffffff18;
  shared_ptr<spdlog::details::thread_pool> *in_stack_ffffffffffffff20;
  shared_ptr<spdlog::details::thread_pool> *tp_00;
  registry *this;
  registry *in_stack_ffffffffffffff38;
  async_overflow_policy *in_stack_ffffffffffffff40;
  element_type *__args;
  shared_ptr<spdlog::logger> local_a0;
  undefined4 local_90;
  undefined1 local_89;
  async_overflow_policy local_78 [4];
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  registry *in_stack_ffffffffffffffa0;
  undefined8 local_28;
  undefined8 local_20;
  
  __args = in_RDI;
  local_20 = details::registry::instance();
  local_28 = details::registry::tp_mutex((registry *)local_20);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
            );
  details::registry::get_tp(in_stack_ffffffffffffff38);
  bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    in_stack_ffffffffffffff9c = 1;
    std::make_shared<spdlog::details::thread_pool,unsigned_long_const&,int>
              ((unsigned_long *)in_RSI,(int *)in_stack_ffffffffffffff40);
    this = (registry *)&stack0xffffffffffffffc0;
    tp_00 = (shared_ptr<spdlog::details::thread_pool> *)&stack0xffffffffffffffa0;
    std::shared_ptr<spdlog::details::thread_pool>::operator=
              (in_stack_ffffffffffffff20,
               (shared_ptr<spdlog::details::thread_pool> *)in_stack_ffffffffffffff18);
    std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
              ((shared_ptr<spdlog::details::thread_pool> *)0x19586b);
    in_stack_ffffffffffffff40 = local_78;
    std::shared_ptr<spdlog::details::thread_pool>::shared_ptr
              (in_stack_ffffffffffffff20,
               (shared_ptr<spdlog::details::thread_pool> *)in_stack_ffffffffffffff18);
    details::registry::set_tp(this,tp_00);
    std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
              ((shared_ptr<spdlog::details::thread_pool> *)0x1958a7);
  }
  std::
  make_shared<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
            ((color_mode *)in_RSI);
  local_89 = 0;
  local_90 = 0;
  std::
  make_shared<spdlog::async_logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>>,std::shared_ptr<spdlog::details::thread_pool>,spdlog::async_overflow_policy>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
             (shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>_>
              *)in_RDI,in_RSI,in_stack_ffffffffffffff40);
  std::shared_ptr<spdlog::logger>::shared_ptr<spdlog::async_logger,void>
            (&local_a0,(shared_ptr<spdlog::async_logger> *)local_20);
  details::registry::initialize_logger
            (in_stack_ffffffffffffffa0,
             (shared_ptr<spdlog::logger> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x19597c);
  local_89 = 1;
  std::shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>_>::
  ~shared_ptr((shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>_>
               *)0x1959de);
  std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
            ((shared_ptr<spdlog::details::thread_pool> *)0x1959eb);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1959f8);
  sVar2.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __args;
  return (shared_ptr<spdlog::async_logger>)
         sVar2.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<async_logger> create(std::string logger_name, SinkArgs &&... args)
    {
        auto &registry_inst = details::registry::instance();

        // create global thread pool if not already exists..

        auto &mutex = registry_inst.tp_mutex();
        std::lock_guard<std::recursive_mutex> tp_lock(mutex);
        auto tp = registry_inst.get_tp();
        if (tp == nullptr)
        {
            tp = std::make_shared<details::thread_pool>(details::default_async_q_size, 1);
            registry_inst.set_tp(tp);
        }

        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<async_logger>(std::move(logger_name), std::move(sink), std::move(tp), OverflowPolicy);
        registry_inst.initialize_logger(new_logger);
        return new_logger;
    }